

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

EnumValueDescriptorProto * __thiscall
google::protobuf::EnumValueDescriptorProto::New(EnumValueDescriptorProto *this,Arena *arena)

{
  EnumValueDescriptorProto *this_00;
  
  this_00 = (EnumValueDescriptorProto *)operator_new(0x30);
  EnumValueDescriptorProto(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::EnumValueDescriptorProto>(arena,this_00);
  }
  return this_00;
}

Assistant:

EnumValueDescriptorProto* EnumValueDescriptorProto::New(::google::protobuf::Arena* arena) const {
  EnumValueDescriptorProto* n = new EnumValueDescriptorProto;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}